

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O1

void __thiscall SimpleVendor::SimpleVendor(SimpleVendor *this,int argc,char **argv,VendorIo *io)

{
  bool bVar1;
  int iVar2;
  invalid_argument *this_00;
  
  (this->super_Vendor)._vptr_Vendor = (_func_int **)&PTR___cxa_pure_virtual_00180010;
  iVar2 = 0;
  if (argc == 2) {
    iVar2 = atoi(argv[1]);
  }
  (this->super_Vendor).kPrice = iVar2;
  (this->super_Vendor).balance_ = 0;
  (this->super_Vendor)._vptr_Vendor = (_func_int **)&PTR_ValidatePrice_0017ffc8;
  this->vio = io;
  if (iVar2 != 0) {
    bVar1 = ValidatePrice(this);
    if (bVar1) {
      (*this->vio->_vptr_VendorIo[6])(this->vio,(ulong)(uint)(this->super_Vendor).kPrice);
      return;
    }
  }
  (*this->vio->_vptr_VendorIo[1])(this->vio,*argv);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid price");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

SimpleVendor::SimpleVendor(int argc, char **argv, VendorIo *io) : vio(io), Vendor(argc, argv) {
    if (GetPrice() == 0 || !ValidatePrice()) {
        vio->PrintUsage(argv[0]);
        throw invalid_argument("invalid price");
    }
    vio->PrintWelcomeMessage(GetPrice());
}